

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

llama_perf_context_data * __thiscall llama_context::perf_get_data(llama_context *this)

{
  int *piVar1;
  long in_RSI;
  llama_perf_context_data *in_RDI;
  llama_perf_context_data *data;
  int local_10 [4];
  
  memset(in_RDI,0,0x28);
  in_RDI->t_start_ms = (double)*(long *)(in_RSI + 0x360) * 0.001;
  in_RDI->t_load_ms = (double)*(long *)(in_RSI + 0x368) * 0.001;
  in_RDI->t_p_eval_ms = (double)*(long *)(in_RSI + 0x370) * 0.001;
  in_RDI->t_eval_ms = (double)*(long *)(in_RSI + 0x378) * 0.001;
  local_10[1] = 1;
  piVar1 = std::max<int>(local_10 + 1,(int *)(in_RSI + 0x390));
  in_RDI->n_p_eval = *piVar1;
  local_10[0] = 1;
  piVar1 = std::max<int>(local_10,(int *)(in_RSI + 0x394));
  in_RDI->n_eval = *piVar1;
  return in_RDI;
}

Assistant:

llama_perf_context_data llama_context::perf_get_data() const {
    llama_perf_context_data data = {};

    data.t_start_ms  = 1e-3 * t_start_us;
    data.t_load_ms   = 1e-3 * t_load_us;
    data.t_p_eval_ms = 1e-3 * t_p_eval_us;
    data.t_eval_ms   = 1e-3 * t_eval_us;
    data.n_p_eval    = std::max(1, n_p_eval);
    data.n_eval      = std::max(1, n_eval);

    return data;
}